

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O0

void Omega_h::fix_momentum_velocity_verts
               (Mesh *mesh,
               vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *class_pairs,Int comp
               )

{
  void **this;
  bool bVar1;
  Int IVar2;
  Read<signed_char> local_160;
  allocator local_149;
  string local_148 [32];
  Read<signed_char> local_128;
  allocator local_111;
  string local_110 [32];
  Read<signed_char> local_f0;
  Read<signed_char> local_e0;
  undefined1 local_d0 [8];
  Bytes new_marks;
  string local_b8 [32];
  undefined1 local_98 [8];
  Read<signed_char> old_marks;
  string local_80 [48];
  Read<signed_char> local_50;
  undefined1 local_40 [8];
  Read<signed_char> comp_marks;
  Read<signed_char> ent_marks;
  Int ent_dim;
  Int comp_local;
  vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *class_pairs_local;
  Mesh *mesh_local;
  
  ent_marks.write_.shared_alloc_.direct_ptr._0_4_ = 0;
  while( true ) {
    IVar2 = Mesh::dim(mesh);
    if (IVar2 < (int)(uint)ent_marks.write_.shared_alloc_.direct_ptr) break;
    this = &comp_marks.write_.shared_alloc_.direct_ptr;
    mark_class_closures((Omega_h *)this,mesh,(uint)ent_marks.write_.shared_alloc_.direct_ptr,
                        class_pairs);
    Read<signed_char>::Read(&local_50,(Read<signed_char> *)this);
    ent_marks.write_.shared_alloc_.direct_ptr._4_1_ = (byte)comp;
    multiply_each_by<signed_char>
              ((Omega_h *)local_40,&local_50,
               (char)(1 << (ent_marks.write_.shared_alloc_.direct_ptr._4_1_ & 0x1f)));
    Read<signed_char>::~Read(&local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_80,"momentum_velocity_fixed",
               (allocator *)((long)&old_marks.write_.shared_alloc_.direct_ptr + 7));
    bVar1 = Mesh::has_tag(mesh,(uint)ent_marks.write_.shared_alloc_.direct_ptr,(string *)local_80);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&old_marks.write_.shared_alloc_.direct_ptr + 7));
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_b8,"momentum_velocity_fixed",
                 (allocator *)((long)&new_marks.write_.shared_alloc_.direct_ptr + 7));
      Mesh::get_array<signed_char>
                ((Mesh *)local_98,(Int)mesh,
                 (string *)(ulong)(uint)ent_marks.write_.shared_alloc_.direct_ptr);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&new_marks.write_.shared_alloc_.direct_ptr + 7));
      Read<signed_char>::Read(&local_e0,(Read<signed_char> *)local_98);
      Read<signed_char>::Read(&local_f0,(Read<signed_char> *)local_40);
      bit_or_each((Omega_h *)local_d0,&local_e0,&local_f0);
      Read<signed_char>::~Read(&local_f0);
      Read<signed_char>::~Read(&local_e0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_110,"momentum_velocity_fixed",&local_111);
      Read<signed_char>::Read(&local_128,(Read<signed_char> *)local_d0);
      Mesh::set_tag<signed_char>
                (mesh,(uint)ent_marks.write_.shared_alloc_.direct_ptr,(string *)local_110,&local_128
                 ,false);
      Read<signed_char>::~Read(&local_128);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
      Read<signed_char>::~Read((Read<signed_char> *)local_d0);
      Read<signed_char>::~Read((Read<signed_char> *)local_98);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,"momentum_velocity_fixed",&local_149);
      Read<signed_char>::Read(&local_160,(Read<signed_char> *)local_40);
      Mesh::add_tag<signed_char>
                (mesh,(uint)ent_marks.write_.shared_alloc_.direct_ptr,(string *)local_148,1,
                 &local_160,false);
      Read<signed_char>::~Read(&local_160);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
    }
    Read<signed_char>::~Read((Read<signed_char> *)local_40);
    Read<signed_char>::~Read((Read<signed_char> *)&comp_marks.write_.shared_alloc_.direct_ptr);
    ent_marks.write_.shared_alloc_.direct_ptr._0_4_ =
         (uint)ent_marks.write_.shared_alloc_.direct_ptr + 1;
  }
  return;
}

Assistant:

void fix_momentum_velocity_verts(
    Mesh* mesh, std::vector<ClassPair> const& class_pairs, Int comp) {
  for (Int ent_dim = VERT; ent_dim <= mesh->dim(); ++ent_dim) {
    auto ent_marks = mark_class_closures(mesh, ent_dim, class_pairs);
    auto comp_marks = multiply_each_by(ent_marks, I8(1 << comp));
    if (mesh->has_tag(ent_dim, "momentum_velocity_fixed")) {
      auto old_marks = mesh->get_array<I8>(ent_dim, "momentum_velocity_fixed");
      auto new_marks = bit_or_each(old_marks, comp_marks);
      mesh->set_tag(ent_dim, "momentum_velocity_fixed", new_marks);
    } else {
      mesh->add_tag(ent_dim, "momentum_velocity_fixed", 1, comp_marks);
    }
  }
}